

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

extent_t * arena_bin_slabs_nonfull_tryget(bin_t *bin)

{
  uint64_t *puVar1;
  size_t *psVar2;
  extent_t *peVar3;
  
  peVar3 = extent_heap_remove_first(&bin->slabs_nonfull);
  if (peVar3 != (extent_t *)0x0) {
    puVar1 = &(bin->stats).reslabs;
    *puVar1 = *puVar1 + 1;
    psVar2 = &(bin->stats).nonfull_slabs;
    *psVar2 = *psVar2 - 1;
  }
  return peVar3;
}

Assistant:

static extent_t *
arena_bin_slabs_nonfull_tryget(bin_t *bin) {
	extent_t *slab = extent_heap_remove_first(&bin->slabs_nonfull);
	if (slab == NULL) {
		return NULL;
	}
	if (config_stats) {
		bin->stats.reslabs++;
		bin->stats.nonfull_slabs--;
	}
	return slab;
}